

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_undo.c
# Opt level: O1

void canvas_undo_rebranch(_glist *x)

{
  _undo_action *p_Var1;
  int oldstate;
  _undo *p_Var2;
  _undo_action *udo;
  
  oldstate = canvas_suspend_dsp();
  p_Var2 = canvas_undo_get(x);
  if (p_Var2 == (_undo *)0x0) {
    return;
  }
  udo = p_Var2->u_last->next;
  if (udo != (_undo_action *)0x0) {
    do {
      canvas_undo_doit(x,udo,0,"canvas_undo_rebranch");
      p_Var1 = udo->next;
      freebytes(udo,0x30);
      udo = p_Var1;
    } while (p_Var1 != (_undo_action *)0x0);
    p_Var2->u_last->next = (_undo_action *)0x0;
  }
  canvas_show_undomenu(x,p_Var2->u_last->name,"no");
  canvas_resume_dsp(oldstate);
  return;
}

Assistant:

void canvas_undo_rebranch(t_canvas *x)
{
    int dspwas = canvas_suspend_dsp();
    t_undo_action *a1, *a2;
    t_undo *udo = canvas_undo_get(x);
    if (!udo) return;
    if (udo->u_last->next)
    {
        a1 = udo->u_last->next;
        while(a1)
        {
            canvas_undo_doit(x, a1, UNDO_FREE, __FUNCTION__);
            a2 = a1->next;
            freebytes(a1, sizeof(*a1));
            a1 = a2;
        }
        udo->u_last->next = 0;
    }
    canvas_show_undomenu(x, udo->u_last->name, "no");
    canvas_resume_dsp(dspwas);
}